

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O3

int double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Bignum *pBVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  sVar2 = a->exponent_;
  lVar1 = (long)sVar2 + (long)a->used_bigits_;
  sVar3 = b->exponent_;
  lVar11 = (long)sVar3;
  lVar10 = b->used_bigits_ + lVar11;
  iVar5 = -1;
  iVar9 = (int)lVar10;
  if (iVar9 <= (int)lVar1) {
    if ((int)lVar1 <= iVar9) {
      sVar4 = sVar2;
      if (sVar3 < sVar2) {
        sVar4 = sVar3;
      }
      pBVar8 = (Bignum *)(a->bigits_buffer_ + (long)a->used_bigits_ + -1);
      lVar12 = lVar1;
      while( true ) {
        if (lVar12 <= (int)sVar4) {
          return 0;
        }
        uVar6 = 0;
        uVar7 = 0;
        if (sVar2 < lVar12 && lVar12 <= lVar1) {
          uVar7._0_2_ = pBVar8->used_bigits_;
          uVar7._2_2_ = pBVar8->exponent_;
        }
        if (lVar11 < lVar12 && lVar12 <= lVar10) {
          uVar6 = *(uint *)((long)b + lVar12 * 4 + lVar11 * -4);
        }
        if (uVar7 < uVar6) break;
        pBVar8 = (Bignum *)((long)(pBVar8 + 0xffffffffffffffff) + 0x200);
        lVar12 = lVar12 + -1;
        if (uVar6 < uVar7) {
          return 1;
        }
      }
      return -1;
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int BigitLength() const { return used_bigits_ + exponent_; }